

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

int tkinter3Present(void)

{
  int iVar1;
  char *pcVar2;
  bool local_20a;
  byte local_209;
  undefined1 local_208 [8];
  char lPythonParams [256];
  char lPythonCommand [256];
  
  memcpy(local_208,"-S -c \"try:\n\timport tkinter;\nexcept:\n\tprint(0);\"",0x100);
  if (tkinter3Present::lTkinter3Present < 0) {
    tkinter3Present::lTkinter3Present = 0;
    iVar1 = python3Present();
    if (iVar1 != 0) {
      sprintf(lPythonParams + 0xf8,"%s %s",gPython3Name,local_208);
      tkinter3Present::lTkinter3Present = tryCommand(lPythonParams + 0xf8);
    }
    if (tinyfd_verbose != 0) {
      printf("lTkinter3Present %d\n",(ulong)(uint)tkinter3Present::lTkinter3Present);
    }
  }
  local_209 = 0;
  if (tkinter3Present::lTkinter3Present != 0) {
    iVar1 = graphicMode();
    local_209 = 0;
    if (iVar1 != 0) {
      iVar1 = isDarwin();
      local_20a = false;
      if (iVar1 != 0) {
        pcVar2 = getenv("SSH_TTY");
        local_20a = pcVar2 != (char *)0x0;
      }
      local_209 = local_20a ^ 0xff;
    }
  }
  return (int)(local_209 & 1);
}

Assistant:

static int tkinter3Present( )
{
        static int lTkinter3Present = -1 ;
        char lPythonCommand[256];
        char lPythonParams[256] =
                "-S -c \"try:\n\timport tkinter;\nexcept:\n\tprint(0);\"";

        if ( lTkinter3Present < 0 )
        {
                lTkinter3Present = 0 ;
                if ( python3Present() )
                {
                        sprintf( lPythonCommand , "%s %s" , gPython3Name , lPythonParams ) ;
                        lTkinter3Present = tryCommand(lPythonCommand) ;
                }
                if (tinyfd_verbose) printf("lTkinter3Present %d\n", lTkinter3Present) ;
        }
        return lTkinter3Present && graphicMode() && !(isDarwin() && getenv("SSH_TTY") );
}